

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastEr1S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  char *pcVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar6;
  ulong uVar7;
  ushort *puVar8;
  
  aVar6 = data.field_0;
  if (data.field_0._0_1_ == '\0') {
    bVar1 = ptr[1];
    aVar6._0_4_ = bVar1 - 1;
    aVar6.data._4_4_ = 0;
    if ((byte)aVar6._0_4_ < data.field_0._3_1_) {
      puVar3 = (uint *)RefAt<int>(msg,(ulong)data.field_0 >> 0x30);
      *puVar3 = (uint)bVar1;
      puVar8 = (ushort *)(ptr + 2);
      uVar7 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar8) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar3 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
          *puVar3 = *puVar3 | (uint)uVar7;
        }
        return (char *)puVar8;
      }
      uVar2 = (uint)table->fast_idx_mask & (uint)*puVar8;
      if ((uVar2 & 7) == 0) {
        uVar4 = (ulong)(uVar2 & 0xfffffff8);
        pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                                   (msg,puVar8,ctx,
                                    (ulong)*puVar8 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2)
                                    ,table,uVar7);
        return pcVar5;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  }
  pcVar5 = MiniParse(msg,ptr,ctx,(TcFieldData)aVar6,table,hasbits);
  return pcVar5;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEr1S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularEnumSmallRange<uint8_t, 1>(
      PROTOBUF_TC_PARAM_PASS);
}